

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipelines.cpp
# Opt level: O0

int ifelse_pipe_ans(int a)

{
  int a_local;
  
  a_local = a;
  if (a / 2 != 0) {
    a_local = a + 8;
  }
  if (a_local < 0x1322) {
    a_local = a_local + 3;
  }
  else {
    a_local = a_local + -0x72a;
  }
  if ((a_local + 9) / 4 < 0x32) {
    a_local = a_local + 1;
  }
  else {
    a_local = a_local + 0x11;
  }
  return a_local;
}

Assistant:

int ifelse_pipe_ans(int a) {
  // pipe 1
  if(a / 2 != 0) {
    a += 8;
  }
  // pipe 2
  if(a > 4897) {
    a -= 1834;
  }
  else {
    a += 3;
  }
  // pipe 3
  if((a + 9) / 4 < 50) {
    a += 1;
  }
  else {
    a += 17;
  }

  return a;
}